

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O1

void __thiscall HuffmanEncoder::run(HuffmanEncoder *this)

{
  size_t *psVar1;
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_00;
  int iVar2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  mapped_type *pmVar5;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  _Node *p_Var6;
  _Base_ptr p_Var7;
  HuffmanNode *this_01;
  mapped_type *pmVar8;
  long lVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  char *c;
  long *__k;
  element_type *__k_00;
  shared_ptr<HuffmanNode> node;
  value_type right_son;
  shared_ptr<HuffmanNode> parent;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> symbols;
  stringstream output;
  shared_ptr<HuffmanNode> local_248;
  undefined1 local_238 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_208;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Huffman encryption...",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_208._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_208._M_impl.super__Rb_tree_header._M_header;
  local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_208._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar3,pcVar3 + (this->super_Cryptor).in_message_._M_string_length
            );
  if (local_1b0 != 0) {
    lVar9 = local_1b0;
    __k = local_1b8;
    do {
      pmVar5 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                           *)&local_208,(key_type *)__k);
      *pmVar5 = *pmVar5 + 1;
      __k = (long *)((long)__k + 1);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(local_208._M_impl.super__Rb_tree_header._M_node_count & 0xff);
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                  (bitset<8UL> *)&local_248);
  std::ostream::flush();
  if ((_Rb_tree_header *)local_208._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_208._M_impl.super__Rb_tree_header) {
    p_Var7 = local_208._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(ulong)(byte)(char)p_Var7[1]._M_color;
      __os = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                             (bitset<8UL> *)&local_248);
      local_238._16_8_ = ZEXT18((byte)p_Var7[1].field_0x4);
      std::operator<<(__os,(bitset<8UL> *)(local_238 + 0x10));
      std::ostream::flush();
      local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x28);
      iVar2 = *(int *)&p_Var7[1].field_0x4;
      (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->c_ =
           (char)p_Var7[1]._M_color;
      (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->n_ = iVar2;
      ((local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_).
      super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      ((local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_).
      super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_).
      super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      ((local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_).
      super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HuffmanNode*>
                (&local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      p_Var6 = std::__cxx11::
               list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>::
               _M_create_node<std::shared_ptr<HuffmanNode>const&>
                         ((list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                           *)&this->nodes_,&local_248);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      psVar1 = &(this->nodes_).
                super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_208._M_impl.super__Rb_tree_header);
  }
  if (1 < (this->nodes_).
          super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
          ._M_impl._M_node._M_size) {
    this_00 = &this->nodes_;
    do {
      std::__cxx11::
      list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
      sort<HuffmanComparator>(this_00);
      p_Var4 = (this_00->
               super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var4[1]._M_next;
      local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var4 + 1) + 8);
      if (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::
      list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::_M_erase
                (this_00,(this_00->
                         super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                         )._M_impl._M_node.super__List_node_base._M_next);
      p_Var4 = (this_00->
               super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      local_238._16_8_ = p_Var4[1]._M_next;
      local_238._24_8_ = *(_List_node_base **)((long)(p_Var4 + 1) + 8);
      if ((element_type *)local_238._24_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)local_238._24_8_)->left_).
                   super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((element_type *)local_238._24_8_)->left_).
                        super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)local_238._24_8_)->left_).
                   super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((element_type *)local_238._24_8_)->left_).
                        super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      std::__cxx11::
      list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::_M_erase
                (this_00,(this_00->
                         super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                         )._M_impl._M_node.super__List_node_base._M_next);
      this_01 = (HuffmanNode *)operator_new(0x28);
      HuffmanNode::HuffmanNode(this_01,&local_248,(shared_ptr<HuffmanNode> *)(local_238 + 0x10));
      local_238._32_8_ = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HuffmanNode*>
                (&local_210,this_01);
      p_Var6 = std::__cxx11::
               list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>::
               _M_create_node<std::shared_ptr<HuffmanNode>const&>
                         ((list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                           *)this_00,(shared_ptr<HuffmanNode> *)(local_238 + 0x20));
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      psVar1 = &(this->nodes_).
                super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
      }
      if ((element_type *)local_238._24_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._24_8_);
      }
      if (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    } while (1 < (this->nodes_).
                 super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                 ._M_impl._M_node._M_size);
  }
  build(this,(shared_ptr<HuffmanNode> *)
             ((this->nodes_).
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
              ._M_impl._M_node.super__List_node_base._M_next + 1));
  pcVar3 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar3,pcVar3 + (this->super_Cryptor).in_message_._M_string_length
            );
  if (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var10._M_pi = local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
    __k_00 = local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    do {
      pmVar8 = std::
               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->table_,&__k_00->c_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pmVar8->_M_dataplus)._M_p,pmVar8->_M_string_length);
      std::ostream::flush();
      __k_00 = (element_type *)&__k_00->field_0x1;
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&_Var10._M_pi[-1]._M_weak_count + 3);
    } while (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
  }
  if (local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_238) {
    operator_delete(local_248.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_238._0_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,(string *)local_1d8)
  ;
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"encryption done!",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&local_208);
  return;
}

Assistant:

void HuffmanEncoder::run() {
  cout << "Huffman encryption..." << endl;

  //find number of occurrence of each symbol
  map<char, int> symbols;
  for (auto& c : get_in_message()) {
    symbols[c]++;
  }

  //initial list of leaves & saving to output
  stringstream output;
  output << bitset<8>(symbols.size()) << flush;
  for (auto& symbol : symbols) {
    output << bitset<8>(static_cast<unsigned long long int>(symbol.first))
      << bitset<8>(static_cast<unsigned long long int>(symbol.second)) << flush;
    shared_ptr<HuffmanNode> node(new HuffmanNode(symbol.first, symbol.second));
    nodes_.push_back(node);
  }

  //building the tree
  while (nodes_.size() > 1) {
    nodes_.sort(HuffmanComparator());

    auto left_son = nodes_.front();
    nodes_.pop_front();
    auto right_son = nodes_.front();
    nodes_.pop_front();

    shared_ptr<HuffmanNode> parent(new HuffmanNode(left_son, right_son));
    nodes_.push_back(parent);
  }

  //building code table
  build(nodes_.front());

  //saving encoded message
  for (auto& c : get_in_message()) {
    output << table_[c] << flush;
  }
  set_out_message(output.str());

  cout << "encryption done!" << endl;
}